

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

int __thiscall ProString::lastIndexOf(ProString *this,QString *s,int from,CaseSensitivity cs)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  QStringView s_00;
  QStringView local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.m_data = (this->m_string).d.ptr;
  local_38.m_size = (this->m_string).d.size;
  local_38 = QStringView::mid(&local_38,(long)this->m_offset,(long)this->m_length);
  s_00.m_data = (s->d).ptr;
  s_00.m_size = (s->d).size;
  qVar1 = QStringView::lastIndexOf(&local_38,s_00,(long)from,cs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)qVar1;
  }
  __stack_chk_fail();
}

Assistant:

int lastIndexOf(const QString &s, int from = -1, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return toQStringView().lastIndexOf(s, from, cs); }